

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O2

int __thiscall jrtplib::RTPFakeTransmitter::CreateLocalIPList(RTPFakeTransmitter *this)

{
  GetLocalIPList_DNS(this);
  AddLoopbackAddress(this);
  return 0;
}

Assistant:

int RTPFakeTransmitter::CreateLocalIPList()
{
	 // first try to obtain the list from the network interface info

	if (!GetLocalIPList_Interfaces())
	{
		// If this fails, we'll have to depend on DNS info
		GetLocalIPList_DNS();
	}
	AddLoopbackAddress();
	return 0;
}